

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QVariant>::copyAppend
          (QGenericArrayOps<QVariant> *this,QVariant *b,QVariant *e)

{
  qsizetype *pqVar1;
  QVariant *pQVar2;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QVariant>).ptr;
    do {
      QVariant::QVariant(pQVar2 + (this->super_QArrayDataPointer<QVariant>).size,b);
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QVariant>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }